

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Pgno finalDbSize(BtShared *pBt,Pgno nOrig,Pgno nFree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = pBt->usableSize;
  if (nOrig < 2) {
    iVar5 = 0;
    uVar2 = (uint)sqlite3PendingByte / pBt->pageSize;
    uVar7 = uVar3 / 5 + 1;
  }
  else {
    uVar7 = uVar3 / 5 + 1;
    iVar5 = (nOrig - 2) - (nOrig - 2) % uVar7;
    uVar2 = (uint)sqlite3PendingByte / pBt->pageSize;
    iVar5 = iVar5 + (uint)(iVar5 + 1U == uVar2) + 2;
  }
  uVar3 = nOrig - (((nFree - nOrig) + uVar3 / 5 + iVar5) / (uVar3 / 5) + nFree);
  uVar6 = uVar2 + 1;
  uVar3 = uVar3 - (uVar3 < uVar6 && uVar6 < nOrig);
  do {
    uVar4 = uVar3;
    uVar1 = 0;
    if (1 < uVar4) {
      iVar5 = (uVar4 - 2) - (uVar4 - 2) % uVar7;
      uVar1 = iVar5 + (uint)(iVar5 + 1U == uVar2) + 2;
    }
    uVar3 = uVar4 - 1;
  } while ((uVar4 == uVar1) || (uVar4 == uVar6));
  return uVar4;
}

Assistant:

static Pgno finalDbSize(BtShared *pBt, Pgno nOrig, Pgno nFree){
  int nEntry;                     /* Number of entries on one ptrmap page */
  Pgno nPtrmap;                   /* Number of PtrMap pages to be freed */
  Pgno nFin;                      /* Return value */

  nEntry = pBt->usableSize/5;
  nPtrmap = (nFree-nOrig+PTRMAP_PAGENO(pBt, nOrig)+nEntry)/nEntry;
  nFin = nOrig - nFree - nPtrmap;
  if( nOrig>PENDING_BYTE_PAGE(pBt) && nFin<PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }
  while( PTRMAP_ISPAGE(pBt, nFin) || nFin==PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }

  return nFin;
}